

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IniFile.cpp
# Opt level: O0

String * __thiscall asl::IniFile::operator[](IniFile *this,String *name)

{
  Map<asl::String,_asl::String> *pMVar1;
  String local_70;
  Map<asl::String,_asl::String> *local_48;
  Section *section;
  String sec;
  int slash;
  String *name_local;
  IniFile *this_local;
  
  sec.field_2._12_4_ = asl::String::indexOf(name,'/',0);
  if ((int)sec.field_2._12_4_ < 0) {
    pMVar1 = &Map<asl::String,_asl::Dic<asl::String>_>::operator[]
                        ((Map<asl::String,_asl::Dic<asl::String>_> *)this,&this->_currentTitle)->
              super_Map<asl::String,_asl::String>;
    this_local = (IniFile *)Map<asl::String,_asl::String>::operator[](pMVar1,name);
  }
  else {
    asl::String::substring((String *)&section,name,0,sec.field_2._12_4_);
    pMVar1 = &Map<asl::String,_asl::Dic<asl::String>_>::operator[]
                        ((Map<asl::String,_asl::Dic<asl::String>_> *)this,(String *)&section)->
              super_Map<asl::String,_asl::String>;
    local_48 = pMVar1;
    asl::String::substring(&local_70,name,sec.field_2._12_4_ + 1);
    this_local = (IniFile *)Map<asl::String,_asl::String>::operator[](pMVar1,&local_70);
    asl::String::~String(&local_70);
    asl::String::~String((String *)&section);
  }
  return (String *)this_local;
}

Assistant:

String& IniFile::operator[](const String& name)
{
	int slash = name.indexOf('/');
	if(slash < 0)
	{
		return _sections[_currentTitle][name];
	}
	else
	{
		String sec = name.substring(0, slash);
		Section& section = _sections[sec];
		return section[name.substring(slash + 1)];
	}
}